

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

CURLcode Curl_pollfds_add_ps(curl_pollfds *cpfds,easy_pollset *ps)

{
  CURLcode CVar1;
  ushort local_2a;
  ulong uStack_28;
  short events;
  size_t i;
  easy_pollset *ps_local;
  curl_pollfds *cpfds_local;
  
  uStack_28 = 0;
  while( true ) {
    if (ps->num <= uStack_28) {
      return CURLE_OK;
    }
    local_2a = (ushort)((ps->actions[uStack_28] & 1) != 0);
    if ((ps->actions[uStack_28] & 2) != 0) {
      local_2a = local_2a | 4;
    }
    if ((local_2a != 0) &&
       (CVar1 = cpfds_add_sock(cpfds,ps->sockets[uStack_28],local_2a,true), CVar1 != CURLE_OK))
    break;
    uStack_28 = uStack_28 + 1;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_pollfds_add_ps(struct curl_pollfds *cpfds,
                             struct easy_pollset *ps)
{
  size_t i;

  DEBUGASSERT(cpfds);
  DEBUGASSERT(ps);
  for(i = 0; i < ps->num; i++) {
    short events = 0;
    if(ps->actions[i] & CURL_POLL_IN)
      events |= POLLIN;
    if(ps->actions[i] & CURL_POLL_OUT)
      events |= POLLOUT;
    if(events) {
      if(cpfds_add_sock(cpfds, ps->sockets[i], events, TRUE))
        return CURLE_OUT_OF_MEMORY;
    }
  }
  return CURLE_OK;
}